

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

DatatypeValidator * __thiscall
xercesc_4_0::TraverseSchema::getAttrDatatypeValidatorNS
          (TraverseSchema *this,DOMElement *elem,XMLCh *localPart,XMLCh *typeURI)

{
  SchemaInfo **enclosingSchema;
  XMLCh XVar1;
  XMLCh XVar2;
  uint saveScope;
  SchemaInfo *toRestore;
  ValueVectorOf<int> *pVVar3;
  ulong uVar4;
  SchemaInfo *pSVar5;
  RefVectorOf<xercesc_4_0::SchemaInfo> *pRVar6;
  long lVar7;
  ListType aListType;
  int iVar8;
  DatatypeValidator *pDVar9;
  XMLCh *pXVar10;
  DOMElement *childElem;
  SchemaInfo *toRestore_00;
  XMLCh *pXVar11;
  ulong uVar12;
  ulong uVar13;
  XMLSize_t XVar14;
  XMLSize_t getAt;
  bool bVar15;
  
  pDVar9 = getDatatypeValidator(this,typeURI,localPart);
  pXVar10 = this->fTargetNSURIString;
  bVar15 = true;
  if (pXVar10 != typeURI) {
    pXVar11 = typeURI;
    if (pXVar10 == (XMLCh *)0x0 || typeURI == (XMLCh *)0x0) {
      if (typeURI == (XMLCh *)0x0) {
        if (pXVar10 != (XMLCh *)0x0) goto LAB_0033742c;
      }
      else {
        bVar15 = *typeURI == L'\0';
        if (bVar15 && pXVar10 != (XMLCh *)0x0) {
LAB_0033742c:
          bVar15 = *pXVar10 == L'\0';
        }
      }
    }
    else {
      do {
        XVar1 = *pXVar11;
        if (XVar1 == L'\0') goto LAB_0033742c;
        XVar2 = *pXVar10;
        pXVar10 = pXVar10 + 1;
        pXVar11 = pXVar11 + 1;
      } while (XVar1 == XVar2);
      bVar15 = false;
    }
  }
  enclosingSchema = &this->fSchemaInfo;
  toRestore = this->fSchemaInfo;
  saveScope = this->fCurrentScope;
  aListType = INCLUDE;
  if (((typeURI == (XMLCh *)0x0) || (bVar15)) || (*typeURI == L'\0')) goto LAB_00337538;
  iVar8 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])();
  pVVar3 = this->fImportedNSList;
  if (pVVar3 == (ValueVectorOf<int> *)0x0) {
LAB_003374fd:
    reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x8e,typeURI,
                      (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    bVar15 = false;
LAB_0033752a:
    aListType = INCLUDE;
  }
  else {
    uVar4 = pVVar3->fCurCount;
    bVar15 = uVar4 != 0;
    if (uVar4 == 0) {
LAB_003374c5:
      if (!bVar15) goto LAB_003374fd;
    }
    else if (*pVVar3->fElemList != iVar8) {
      uVar12 = 0;
      do {
        uVar13 = uVar4;
        if (uVar4 - 1 == uVar12) break;
        uVar13 = uVar12 + 1;
        lVar7 = uVar12 + 1;
        uVar12 = uVar13;
      } while (pVVar3->fElemList[lVar7] != iVar8);
      bVar15 = uVar13 < uVar4;
      goto LAB_003374c5;
    }
    bVar15 = true;
    if (pDVar9 != (DatatypeValidator *)0x0) goto LAB_0033752a;
    pSVar5 = *enclosingSchema;
    pRVar6 = pSVar5->fImportedInfoList;
    if (pRVar6 == (RefVectorOf<xercesc_4_0::SchemaInfo> *)0x0) {
      XVar14 = 0;
    }
    else {
      XVar14 = (pRVar6->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fCurCount;
    }
    if (XVar14 != 0) {
      getAt = 0;
      do {
        toRestore_00 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt
                                 (&pSVar5->fImportedInfoList->
                                   super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,getAt);
        if (toRestore_00->fTargetNSURI == iVar8) goto LAB_003375e5;
        getAt = getAt + 1;
      } while (XVar14 != getAt);
    }
    toRestore_00 = (SchemaInfo *)0x0;
LAB_003375e5:
    if ((toRestore_00 == (SchemaInfo *)0x0) || (toRestore_00->fProcessed == true)) {
      reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x28,typeURI,localPart
                        ,(XMLCh *)0x0,(XMLCh *)0x0);
      aListType = INCLUDE;
      bVar15 = false;
    }
    else {
      restoreSchemaInfo(this,toRestore_00,IMPORT,0xfffffffe);
      bVar15 = true;
      aListType = IMPORT;
    }
  }
  if (!bVar15) {
    return (DatatypeValidator *)0x0;
  }
LAB_00337538:
  if (pDVar9 == (DatatypeValidator *)0x0) {
    childElem = SchemaInfo::getTopLevelComponent
                          (*enclosingSchema,1,L"simpleType",localPart,enclosingSchema);
    if (childElem == (DOMElement *)0x0) {
      pDVar9 = (DatatypeValidator *)0x0;
    }
    else {
      pDVar9 = traverseSimpleTypeDecl(this,childElem,true,0);
    }
    if (toRestore != *enclosingSchema) {
      restoreSchemaInfo(this,toRestore,aListType,saveScope);
    }
  }
  return pDVar9;
}

Assistant:

DatatypeValidator*
TraverseSchema::getAttrDatatypeValidatorNS(const DOMElement* const elem,
                                           const XMLCh* localPart,
                                           const XMLCh* typeURI)
{
    DatatypeValidator*   dv = getDatatypeValidator(typeURI, localPart);
    SchemaInfo::ListType infoType = SchemaInfo::INCLUDE;
    SchemaInfo*          saveInfo = fSchemaInfo;
    unsigned int         saveScope = fCurrentScope;

    if (!XMLString::equals(typeURI, fTargetNSURIString)
        && (typeURI && *typeURI)) {

        // Make sure that we have an explicit import statement.
        // Clause 4 of Schema Representation Constraint:
        // http://www.w3.org/TR/xmlschema-1/#src-resolve
        unsigned int uriId = fURIStringPool->addOrFind(typeURI);

        if (!isImportingNS(uriId)) {

            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidNSReference, typeURI);
            return 0;
        }

        if (!dv) {
            SchemaInfo* impInfo = fSchemaInfo->getImportInfo(uriId);

            if (!impInfo || impInfo->getProcessed())
            {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TypeNotFound, typeURI, localPart);
                return 0;
            }

            infoType = SchemaInfo::IMPORT;
            restoreSchemaInfo(impInfo, infoType);
        }
    }

    if (!dv) {

        DOMElement* typeElem = fSchemaInfo->getTopLevelComponent
        (
            SchemaInfo::C_SimpleType
            , SchemaSymbols::fgELT_SIMPLETYPE
            , localPart
            , &fSchemaInfo
        );

        if (typeElem)
            dv = traverseSimpleTypeDecl(typeElem);

        // restore schema information, if necessary
        if (saveInfo != fSchemaInfo) {
            restoreSchemaInfo(saveInfo, infoType, saveScope);
        }
    }

    return dv;
}